

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::DataBarReader::decodePattern
          (Barcode *__return_storage_ptr__,DataBarReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  DecodingState *pDVar1;
  Iterator puVar2;
  int iVar3;
  bool bVar4;
  char __rhs;
  State *this_00;
  ZXing *pZVar5;
  __node_base *p_Var6;
  Pair *first;
  ZXing *this_01;
  int iVar7;
  int iVar8;
  __node_base *p_Var9;
  Pair *last;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_1f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [32];
  PointT<int> local_178;
  PointT<int> PStack_170;
  PointT<int> local_168;
  PointT<int> PStack_160;
  Position local_158;
  Content local_138;
  Pair leftPair;
  
  this_00 = (State *)(state->_M_t).
                     super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                     .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>.
                     _M_head_impl;
  if (this_00 == (State *)0x0) {
    this_00 = (State *)operator_new(0x78);
    State::State(this_00);
    pDVar1 = (state->_M_t).
             super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             ._M_t.
             super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl =
         (DecodingState *)this_00;
    if (pDVar1 != (DecodingState *)0x0) {
      (*pDVar1->_vptr_DecodingState[1])();
      this_00 = (State *)(state->_M_t).
                         super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                         .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>.
                         _M_head_impl;
    }
  }
  next->_size = 0x16;
  while ((puVar2 = next->_data, puVar2 != (Iterator)0x0 &&
         (next->_data = puVar2 + 1, puVar2 + (long)next->_size + 1 <= next->_end))) {
    bVar4 = DataBar::IsFinder((uint)puVar2[9],(uint)puVar2[10],(uint)puVar2[0xb],(uint)puVar2[0xc],
                              (uint)puVar2[0xd]);
    if ((bVar4) &&
       (((bVar4 = DataBar::IsGuard((uint)next->_data[-1],(uint)next->_data[0xb]), bVar4 &&
         (bVar4 = IsCharacterPair(*next,0x10,0xf), bVar4)) &&
        (ReadPair(&leftPair,next,false), leftPair.finder != 0)))) {
      leftPair.y = rowNumber;
      std::__detail::
      _Insert_base<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this_00->leftPairs,&leftPair);
      if (next->_data != (Iterator)0x0) {
        next->_data = next->_data + 0x14;
      }
    }
    puVar2 = next->_data;
    if ((((puVar2 != (Iterator)0x0) &&
         (next->_data = puVar2 + 1, puVar2 + (long)next->_size + 1 <= next->_end)) &&
        ((bVar4 = DataBar::IsFinder((uint)puVar2[0xd],(uint)puVar2[0xc],(uint)puVar2[0xb],
                                    (uint)puVar2[10],(uint)puVar2[9]), bVar4 &&
         ((bVar4 = DataBar::IsGuard((uint)next->_data[9],(uint)next->_data[0x15]), bVar4 &&
          (bVar4 = IsCharacterPair(*next,0xf,0x10), bVar4)))))) &&
       (ReadPair(&leftPair,next,true), leftPair.finder != 0)) {
      leftPair.y = rowNumber;
      std::__detail::
      _Insert_base<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this_00->rightPairs,&leftPair);
      if (next->_data != (Iterator)0x0) {
        next->_data = next->_data + 0x17;
      }
    }
  }
  p_Var6 = &(this_00->leftPairs)._M_h._M_before_begin;
  do {
    p_Var6 = p_Var6->_M_nxt;
    p_Var9 = &(this_00->rightPairs)._M_h._M_before_begin;
    if (p_Var6 == (__node_base *)0x0) {
      next->_base = (Iterator)0x0;
      next->_end = (Iterator)0x0;
      next->_data = (Iterator)0x0;
      *(undefined8 *)&next->_size = 0;
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      iVar8 = (int)*(size_t *)(p_Var6 + 3);
      iVar7 = (int)*(size_t *)(p_Var9 + 3);
      iVar3 = -iVar8;
      if (0 < iVar8) {
        iVar3 = iVar8;
      }
      iVar8 = -iVar7;
      if (0 < iVar7) {
        iVar8 = iVar7;
      }
      iVar7 = iVar8 + iVar3 * 9 + -10;
      iVar8 = iVar8 + -0xb + iVar3 * 9;
      if (iVar7 < 0x49) {
        iVar8 = iVar7;
      }
      if ((*(int *)&((_Prime_rehash_policy *)(p_Var6 + 2))->field_0x4 * 4 +
           *(int *)((long)(p_Var6 + 1) + 4) + *(int *)((long)(p_Var9 + 1) + 4) * 0x10 +
          *(int *)&((_Prime_rehash_policy *)(p_Var9 + 2))->field_0x4 * 0x40) % 0x4f ==
          iVar8 - (uint)(8 < iVar8)) {
        pZVar5 = (ZXing *)((long)(int)*(size_type *)(p_Var9 + 1) * 0x63d +
                          ((long)(int)*(size_type *)(p_Var6 + 1) * 0x63d +
                          (long)(int)((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor) *
                          0x453af5 +
                          (long)(int)((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor);
        this_01 = pZVar5 + -10000000000000;
        if ((long)pZVar5 < 10000000000000) {
          this_01 = pZVar5;
        }
        ToString<long_long,void>((string *)local_198,this_01,0xd,(int)pZVar5);
        __rhs = GTIN::ComputeCheckDigit<char>((string *)local_198,false);
        std::operator+(&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,__rhs);
        std::__cxx11::string::~string((string *)local_198);
        ByteArray::ByteArray((ByteArray *)&local_1d0,&local_1b8);
        Content::Content(&local_138,(ByteArray *)&local_1d0,(SymbologyIdentifier)0x3065);
        first = (Pair *)(p_Var6 + 1);
        last = (Pair *)(p_Var9 + 1);
        DecoderResult::DecoderResult((DecoderResult *)&leftPair,&local_138);
        DataBar::EstimateLineCount(first,last);
        _Stack_1f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_1f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _Stack_1f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        DataBar::EstimatePosition(&local_158,first,last);
        local_198._16_8_ = 0;
        local_198._24_8_ = 0;
        local_198._0_8_ = (pointer)0x0;
        local_198._8_8_ = (pointer)0x0;
        _Stack_1f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Stack_1f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_1f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_178 = local_158.super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
        PStack_170 = local_158.super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
        local_168 = local_158.super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
        PStack_160 = local_158.super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
        Result::Result(__return_storage_ptr__,(DecoderResult *)&leftPair,(DetectorResult *)local_198
                       ,DataBar);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_198 + 8));
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_1f0)
        ;
        DecoderResult::~DecoderResult((DecoderResult *)&leftPair);
        Content::~Content(&local_138);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::
        _Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(&(this_00->leftPairs)._M_h,first);
        std::
        _Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(&(this_00->rightPairs)._M_h,last);
        return __return_storage_ptr__;
      }
    }
  } while( true );
}

Assistant:

Barcode DataBarReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>& state) const
{
#if 0 // non-stacked version
	next = next.subView(-1, FULL_PAIR_SIZE + 1); // +1 reflects the guard pattern on the right, see IsRightPair());
	// yes: the first view we test is at index 1 (black bar at 0 would be the guard pattern)
	while (next.shift(2)) {
		if (IsLeftPair(next)) {
			if (auto leftPair = ReadPair(next, false); leftPair && next.shift(FULL_PAIR_SIZE) && IsRightPair(next)) {
				if (auto rightPair = ReadPair(next, true); rightPair && ChecksumIsValid(leftPair, rightPair)) {
					return {ConstructText(leftPair, rightPair), rowNumber, leftPair.xStart, rightPair.xStop,
							BarcodeFormat::DataBar};
				}
			}
		}
	}
#else
	if (!state)
		state.reset(new State);
	auto* prevState = static_cast<State*>(state.get());

	next = next.subView(0, FULL_PAIR_SIZE + 1); // +1 reflects the guard pattern on the right, see IsRightPair()
	// yes: the first view we test is at index 1 (black bar at 0 would be the guard pattern)
	while (next.shift(1)) {
		if (IsLeftPair(next)) {
			if (auto leftPair = ReadPair(next, false)) {
				leftPair.y = rowNumber;
				prevState->leftPairs.insert(leftPair);
				next.shift(FULL_PAIR_SIZE - 1);
			}
		}

		if (next.shift(1) && IsRightPair(next)) {
			if (auto rightPair = ReadPair(next, true)) {
				rightPair.y = rowNumber;
				prevState->rightPairs.insert(rightPair);
				next.shift(FULL_PAIR_SIZE + 2);
			}
		}
	}

	for (const auto& leftPair : prevState->leftPairs)
		for (const auto& rightPair : prevState->rightPairs)
			if (ChecksumIsValid(leftPair, rightPair)) {
				// Symbology identifier ISO/IEC 24724:2011 Section 9 and GS1 General Specifications 5.1.3 Figure 5.1.3-2
				Barcode res{DecoderResult(Content(ByteArray(ConstructText(leftPair, rightPair)), {'e', '0'}))
								.setLineCount(EstimateLineCount(leftPair, rightPair)),
							{{}, EstimatePosition(leftPair, rightPair)},
							BarcodeFormat::DataBar};

				prevState->leftPairs.erase(leftPair);
				prevState->rightPairs.erase(rightPair);
				return res;
			}
#endif

	// guarantee progress (see loop in ODReader.cpp)
	next = {};

	return {};
}